

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O3

TypedName * __thiscall
VkSpecParser::parseParamOrProto(TypedName *__return_storage_ptr__,VkSpecParser *this,QString *tag)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  char cVar4;
  int iVar5;
  short *psVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  undefined1 auVar12 [16];
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->typeSuffix).d.d = (Data *)0x0;
  (__return_storage_ptr__->typeSuffix).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->type).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->type).d.size = 0;
  (__return_storage_ptr__->name).d.size = 0;
  (__return_storage_ptr__->type).d.d = (Data *)0x0;
  (__return_storage_ptr__->name).d.d = (Data *)0x0;
  (__return_storage_ptr__->name).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->typeSuffix).d.size = 0;
  cVar4 = QXmlStreamReader::atEnd();
  if (cVar4 == '\0') {
    do {
      QXmlStreamReader::readNext();
      iVar5 = QXmlStreamReader::tokenType();
      if (iVar5 == 5) {
        QVar11 = (QStringView)QXmlStreamReader::name();
        if (QVar11.m_size == (tag->d).size) {
          QVar8.m_data = (tag->d).ptr;
          QVar8.m_size = QVar11.m_size;
          cVar4 = QtPrivate::equalStrings(QVar11,QVar8);
          if (cVar4 != '\0') break;
        }
      }
      iVar5 = QXmlStreamReader::tokenType();
      if (iVar5 == 4) {
        auVar12 = QXmlStreamReader::name();
        if (auVar12._0_8_ == 4) {
          QVar11.m_data = auVar12._8_8_;
          QVar11.m_size = 4;
          QVar9.m_data = L"name";
          QVar9.m_size = 4;
          cVar4 = QtPrivate::equalStrings(QVar11,QVar9);
          if (cVar4 != '\0') {
            parseName(&local_58,this);
            pQVar1 = &((__return_storage_ptr__->name).d.d)->super_QArrayData;
            pcVar2 = (__return_storage_ptr__->name).d.ptr;
            (__return_storage_ptr__->name).d.d = local_58.d.d;
            (__return_storage_ptr__->name).d.ptr = local_58.d.ptr;
            qVar3 = (__return_storage_ptr__->name).d.size;
            (__return_storage_ptr__->name).d.size = local_58.d.size;
            local_58.d.d = (Data *)pQVar1;
            local_58.d.ptr = pcVar2;
            local_58.d.size = qVar3;
            if (pQVar1 != (QArrayData *)0x0) {
              LOCK();
              (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar1,2,0x10);
              }
            }
            goto LAB_00104185;
          }
        }
        auVar12 = QXmlStreamReader::name();
        if (auVar12._0_8_ == 4) {
          QVar7.m_data = auVar12._8_8_;
          QVar7.m_size = 4;
          QVar10.m_data = L"type";
          QVar10.m_size = 4;
          cVar4 = QtPrivate::equalStrings(QVar7,QVar10);
          if (cVar4 != '\0') goto LAB_00104185;
        }
        skip(this);
      }
      else {
        QVar11 = (QStringView)QXmlStreamReader::text();
        auVar12 = QtPrivate::trimmed(QVar11);
        psVar6 = auVar12._8_8_;
        if (auVar12._0_8_ != 0) {
          if (*psVar6 == 0x5b) {
            QString::append((QChar *)&__return_storage_ptr__->typeSuffix,(longlong)psVar6);
          }
          else {
            if ((__return_storage_ptr__->type).d.size != 0) {
              QString::append((QChar)(char16_t)&__return_storage_ptr__->type);
            }
            QString::append((QChar *)&__return_storage_ptr__->type,(longlong)psVar6);
          }
        }
      }
LAB_00104185:
      cVar4 = QXmlStreamReader::atEnd();
    } while (cVar4 == '\0');
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

VkSpecParser::TypedName VkSpecParser::parseParamOrProto(const QString &tag)
{
    TypedName t;

    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isEndElement() && m_reader.name() == tag)
            break;
        if (m_reader.isStartElement()) {
            if (m_reader.name() == QStringLiteral("name")) {
                t.name = parseName();
            } else if (m_reader.name() != QStringLiteral("type")) {
                skip();
            }
        } else {
            auto text = m_reader.text().trimmed();
            if (!text.isEmpty()) {
                if (text.startsWith(u'[')) {
                    t.typeSuffix += text;
                } else {
                    if (!t.type.isEmpty())
                        t.type += u' ';
                    t.type += text;
                }
            }
        }
    }

    return t;
}